

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

ListBuilder * __thiscall
capnp::_::PointerBuilder::getStructList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,StructSize elementSize,
          word *defaultValue)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  BuilderArena *pBVar4;
  SegmentBuilder *this_00;
  SegmentBuilder *pSVar5;
  ulong uVar6;
  undefined8 *puVar7;
  word *pwVar8;
  uint uVar9;
  WirePointer *pWVar10;
  WirePointer *pWVar11;
  uint uVar12;
  ulong uVar13;
  WirePointer *src;
  CapTableBuilder *capTable;
  WirePointer *pWVar14;
  ListElementCount LVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  word *result_2;
  word *pwVar20;
  bool bVar21;
  AllocateResult AVar22;
  AllocateResult AVar23;
  AllocateResult AVar24;
  ElementSize oldSize;
  uint local_fc;
  WirePointer *local_f8;
  AllocateResult local_f0;
  ulong local_e0;
  ulong local_d8;
  uint local_cc;
  WirePointer *local_c8;
  WirePointer *local_c0;
  CapTableBuilder *local_b8;
  WirePointer *local_b0;
  WirePointer *local_a8;
  ListBuilder *local_a0;
  ulong local_98;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Fault f;
  
  local_f0.words = (word *)this->pointer;
  local_f0.segment = this->segment;
  capTable = this->capTable;
  uVar12 = (((WirePointer *)local_f0.words)->offsetAndKind).value;
  local_f8 = (WirePointer *)CONCAT44(local_f8._4_4_,elementSize);
  local_fc = (uint)elementSize >> 0x10;
  local_d8 = (ulong)local_fc;
  local_b8 = capTable;
  if ((((WirePointer *)local_f0.words)->field_1).upper32Bits == 0 && uVar12 == 0) goto LAB_003561f8;
  local_c0 = (WirePointer *)local_f0.words + (long)((int)uVar12 >> 2) + 1;
  do {
    pwVar8 = local_f0.words;
    pWVar10 = (WirePointer *)local_f0.words;
    this_00 = local_f0.segment;
    if ((uVar12 & 3) == 2) {
      this_00 = BuilderArena::getSegment
                          ((BuilderArena *)((local_f0.segment)->super_SegmentReader).arena,
                           (SegmentId)
                           ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_f0.words + 4))
                           ->structRef);
      uVar12 = ((WireValue<uint32_t>_conflict *)&pwVar8->content)->value;
      pwVar8 = (this_00->super_SegmentReader).ptr.ptr;
      uVar13 = (ulong)(uVar12 & 0xfffffff8);
      pWVar11 = (WirePointer *)((long)&pwVar8->content + uVar13);
      pWVar10 = (WirePointer *)((long)&pwVar8[1].content + uVar13);
      if ((uVar12 & 4) == 0) {
        local_c0 = pWVar10 + ((int)(pWVar11->offsetAndKind).value >> 2);
        pWVar10 = pWVar11;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)(pWVar11->field_1).structRef);
        local_c0 = (WirePointer *)
                   ((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                   (ulong)((pWVar11->offsetAndKind).value & 0xfffffff8));
      }
    }
    pwVar8 = local_f0.words;
    pSVar5 = local_f0.segment;
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    _kjCondition.left = (pWVar10->offsetAndKind).value & OTHER;
    _kjCondition.right = LIST;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == LIST;
    if (_kjCondition.left == LIST) {
      uVar12 = (pWVar10->field_1).upper32Bits;
      oldSize = (ElementSize)uVar12 & INLINE_COMPOSITE;
      uVar9 = (uint)local_f8;
      if (oldSize == INLINE_COMPOSITE) {
        _kjCondition.left = (uint)*(uint64_t *)&(local_c0->offsetAndKind).value & 3;
        _kjCondition.right = STRUCT;
        _kjCondition.op.content.ptr = " == ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = _kjCondition.left == 0;
        if (_kjCondition.left != 0) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[62]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x5c7,FAILED,"oldTag->kind() == WirePointer::STRUCT",
                     "_kjCondition,\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\""
                     ,&_kjCondition,
                     (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.")
          ;
          goto LAB_0035639f;
        }
        pWVar10 = local_c0 + 1;
        uVar1 = *(ushort *)&local_c0->field_1;
        uVar2 = *(ushort *)((long)&local_c0->field_1 + 2);
        local_d8._0_4_ = (uint)uVar2 + (uint)uVar1;
        local_98 = (ulong)(uint)local_d8;
        LVar15 = (uint)*(uint64_t *)&(local_c0->offsetAndKind).value >> 2 & 0x1fffffff;
        local_e0 = (ulong)LVar15;
        local_cc = (uint)uVar1;
        uVar12 = (uint)uVar2;
        if (uVar2 < (ushort)local_fc || uVar1 < (ushort)local_f8) {
          if (uVar1 <= (ushort)local_f8) {
            local_cc = uVar9;
          }
          uVar12 = local_fc;
          if ((ushort)local_fc < uVar2) {
            uVar12 = (uint)uVar2;
          }
          local_c8 = (WirePointer *)CONCAT44(local_c8._4_4_,local_cc);
          local_cc = local_cc & 0xffff;
          local_d8 = (ulong)((uVar12 & 0xffff) + local_cc);
          uVar13 = local_e0 * local_d8;
          if (0x1ffffffe < uVar13) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&_kjCondition);
          }
          pwVar8 = local_f0.words;
          local_f8 = pWVar10;
          if (((((WireValue<uint32_t>_conflict *)&(local_f0.words)->content)->value & 3) == 2) &&
             (pSVar5 = BuilderArena::getSegment
                                 ((BuilderArena *)((local_f0.segment)->super_SegmentReader).arena,
                                  (SegmentId)
                                  ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)
                                  ((long)local_f0.words + 4))->structRef), pSVar5->readOnly == false
             )) {
            uVar9 = ((WireValue<uint32_t>_conflict *)&pwVar8->content)->value;
            puVar7 = (undefined8 *)
                     ((long)&((pSVar5->super_SegmentReader).ptr.ptr)->content +
                     (ulong)(uVar9 & 0xfffffff8));
            if ((uVar9 & 4) == 0) {
              *puVar7 = 0;
            }
            else {
              *puVar7 = 0;
              puVar7[1] = 0;
            }
          }
          *pwVar8 = 0;
          if (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_f0.words + 4))->upper32Bits
              != 0 || ((WireValue<uint32_t>_conflict *)&(local_f0.words)->content)->value != 0) {
            WireHelpers::zeroObject(local_f0.segment,local_b8,(WirePointer *)local_f0.words);
          }
          AVar24.words = local_f0.words;
          AVar24.segment = local_f0.segment;
          pwVar8 = (local_f0.segment)->pos;
          uVar6 = uVar13 + 1 & 0xffffffff;
          if (((long)((long)((local_f0.segment)->super_SegmentReader).ptr.ptr +
                     (((local_f0.segment)->super_SegmentReader).ptr.size_ * 8 - (long)pwVar8)) >> 3
               < (long)uVar6) || ((local_f0.segment)->pos = pwVar8 + uVar6, pwVar8 == (word *)0x0))
          {
            uVar9 = (int)uVar13 + 2;
            pBVar4 = (BuilderArena *)((local_f0.segment)->super_SegmentReader).arena;
            if (0x1fffffff < uVar9) {
              WireHelpers::allocate::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&_kjCondition);
            }
            AVar24 = BuilderArena::allocate(pBVar4,uVar9);
            ((WireValue<uint32_t>_conflict *)&(local_f0.words)->content)->value =
                 (int)AVar24.words - *(int *)&((AVar24.segment)->super_SegmentReader).ptr.ptr &
                 0xfffffff8U | 2;
            *(uint *)((long)local_f0.words + 4) = ((AVar24.segment)->super_SegmentReader).id.value;
            *(undefined4 *)&(AVar24.words)->content = 1;
            pwVar8 = AVar24.words + 1;
          }
          else {
            ((WireValue<uint32_t>_conflict *)&(local_f0.words)->content)->value =
                 ((uint)((ulong)((long)pwVar8 - (long)local_f0.words) >> 1) & 0xfffffffc) - 3;
          }
          uVar6 = local_98;
          local_f0.words = AVar24.words;
          *(int *)((long)&(local_f0.words)->content + 4) = (int)uVar13 * 8 + 7;
          *(int *)&pwVar8->content = (int)local_e0 * 4;
          *(short *)((long)&pwVar8->content + 4) = (short)local_c8;
          *(short *)((long)&pwVar8->content + 6) = (short)uVar12;
          pWVar11 = (WirePointer *)(pwVar8 + 1);
          pWVar10 = pWVar11;
          local_fc = uVar12;
          if ((int)local_e0 != 0) {
            uVar13 = local_98 & 0xffffffff;
            local_c8 = (WirePointer *)(pwVar8 + (ulong)((uint)local_c8 & 0xffff) + 1);
            iVar17 = (int)local_d8;
            src = local_c0 + (ulong)uVar1 + 1;
            local_98 = (ulong)(uint)((int)local_98 << 3);
            iVar19 = 0;
            pWVar14 = local_f8;
            local_a8 = pWVar11;
            local_a0 = __return_storage_ptr__;
            do {
              local_f0 = AVar24;
              if (uVar1 != 0) {
                memcpy(pWVar11,pWVar14,(ulong)uVar1 * 8);
              }
              uVar18 = (ulong)uVar2;
              pWVar10 = local_c8;
              local_f8 = pWVar14;
              local_b0 = src;
              AVar24 = local_f0;
              if (uVar2 != 0) {
                do {
                  WireHelpers::transferPointer(local_f0.segment,pWVar10,this_00,src);
                  pWVar10 = pWVar10 + 1;
                  src = src + 1;
                  uVar18 = uVar18 - 1;
                  AVar24 = local_f0;
                } while (uVar18 != 0);
              }
              pWVar11 = pWVar11 + local_d8;
              pWVar14 = local_f8 + uVar13;
              iVar19 = iVar19 + 1;
              local_c8 = (WirePointer *)
                         ((long)&(local_c8->offsetAndKind).value + (ulong)(uint)(iVar17 * 8));
              src = (WirePointer *)((long)&(local_b0->offsetAndKind).value + local_98);
              __return_storage_ptr__ = local_a0;
              pWVar10 = local_a8;
            } while (iVar19 != (int)local_e0);
          }
          capTable = local_b8;
          uVar9 = local_cc;
          uVar13 = (uVar6 & 0xffffffff) * local_e0;
          local_f0 = AVar24;
          if (0x1ffffffe < uVar13) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&_kjCondition);
          }
          uVar12 = local_fc;
          LVar15 = (ListElementCount)local_e0;
          iVar17 = (int)uVar13 + 1;
          if (iVar17 != 0) {
            memset(local_c0,0,(ulong)(uint)(iVar17 * 8));
            LVar15 = (ListElementCount)local_e0;
          }
          this_00 = local_f0.segment;
          local_cc = uVar9;
        }
        goto LAB_00356c5e;
      }
      bVar21 = oldSize == POINTER;
      LVar15 = uVar12 >> 3;
      local_e0 = (ulong)LVar15;
      iVar17 = (int)local_d8;
      if ((uVar12 & 7) == 0) {
        AVar22.words = local_f0.words;
        AVar22.segment = local_f0.segment;
        local_cc = (uint)(ushort)local_f8;
        local_d8 = (ulong)(iVar17 + local_cc);
        uVar13 = local_d8 * local_e0;
        local_a0 = __return_storage_ptr__;
        if (0x1ffffffe < uVar13) {
          WireHelpers::initStructListPointer::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&_kjCondition);
        }
        if (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)pwVar8 + 4))->upper32Bits != 0 ||
            ((WireValue<uint32_t>_conflict *)&pwVar8->content)->value != 0) {
          WireHelpers::zeroObject(pSVar5,local_b8,(WirePointer *)pwVar8);
        }
        pwVar20 = pSVar5->pos;
        uVar6 = uVar13 + 1 & 0xffffffff;
        if (((long)((long)(pSVar5->super_SegmentReader).ptr.ptr +
                   ((pSVar5->super_SegmentReader).ptr.size_ * 8 - (long)pwVar20)) >> 3 < (long)uVar6
            ) || (pSVar5->pos = pwVar20 + uVar6, pwVar20 == (word *)0x0)) {
          uVar12 = (int)uVar13 + 2;
          pBVar4 = (BuilderArena *)(pSVar5->super_SegmentReader).arena;
          if (0x1fffffff < uVar12) {
            WireHelpers::allocate::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&_kjCondition);
          }
          AVar22 = BuilderArena::allocate(pBVar4,uVar12);
          ((WireValue<uint32_t>_conflict *)&pwVar8->content)->value =
               (int)AVar22.words - *(int *)&((AVar22.segment)->super_SegmentReader).ptr.ptr &
               0xfffffff8U | 2;
          *(uint *)((long)pwVar8 + 4) = ((AVar22.segment)->super_SegmentReader).id.value;
          *(undefined4 *)&(AVar22.words)->content = 1;
          pwVar20 = AVar22.words + 1;
        }
        else {
          ((WireValue<uint32_t>_conflict *)&pwVar8->content)->value =
               ((uint)((ulong)((long)pwVar20 - (long)pwVar8) >> 1) & 0xfffffffc) - 3;
        }
        this_00 = AVar22.segment;
        *(int *)((long)&(AVar22.words)->content + 4) = (int)uVar13 * 8 + 7;
        *(ListElementCount *)&pwVar20->content = LVar15 * 4;
        *(short *)((long)&pwVar20->content + 4) = (short)local_f8;
        *(short *)((long)&pwVar20->content + 6) = (short)local_fc;
        pWVar10 = (WirePointer *)(pwVar20 + 1);
        capTable = local_b8;
        __return_storage_ptr__ = local_a0;
        uVar12 = local_fc;
        goto LAB_00356c5e;
      }
      uVar13 = (ulong)oldSize;
      uVar16 = *(uint *)(BITS_PER_ELEMENT_TABLE + uVar13 * 4);
      _kjCondition._0_8_ = &oldSize;
      _kjCondition.op.content.ptr = ") == (e.getType())";
      _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_42934;
      _kjCondition.result = true;
      _kjCondition._25_7_ = 0;
      if (oldSize != BIT) {
        if (oldSize == POINTER) {
          local_fc = iVar17 + (uint)(iVar17 == 0);
        }
        else {
          uVar9 = (uVar9 & 0xffff) + (uint)(((ulong)local_f8 & 0xffff) == 0);
        }
        local_cc = uVar9 & 0xffff;
        local_d8 = (ulong)((local_fc & 0xffff) + local_cc);
        local_b0 = (WirePointer *)(local_d8 * local_e0);
        local_c8 = (WirePointer *)(ulong)uVar16;
        local_a0 = __return_storage_ptr__;
        local_98 = local_e0;
        if (0x1ffffffe < local_b0) {
          WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&_kjCondition);
          uVar16 = (uint)local_c8;
        }
        pwVar8 = local_f0.words;
        if ((((WireValue<uint32_t>_conflict *)&(local_f0.words)->content)->value & 3) == 2) {
          local_f8 = (WirePointer *)CONCAT44(local_f8._4_4_,uVar9);
          pSVar5 = BuilderArena::getSegment
                             ((BuilderArena *)((local_f0.segment)->super_SegmentReader).arena,
                              (SegmentId)
                              ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)
                              ((long)local_f0.words + 4))->structRef);
          uVar16 = (uint)local_c8;
          uVar9 = (uint)local_f8;
          if (pSVar5->readOnly == false) {
            uVar3 = ((WireValue<uint32_t>_conflict *)&pwVar8->content)->value;
            puVar7 = (undefined8 *)
                     ((long)&((pSVar5->super_SegmentReader).ptr.ptr)->content +
                     (ulong)(uVar3 & 0xfffffff8));
            if ((uVar3 & 4) == 0) {
              *puVar7 = 0;
            }
            else {
              *puVar7 = 0;
              puVar7[1] = 0;
            }
          }
        }
        pWVar10 = local_c0;
        iVar17 = (int)local_b0;
        *pwVar8 = 0;
        uVar6 = (long)local_b0 + 1;
        local_f8._0_4_ = (uint)bVar21;
        if (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_f0.words + 4))->upper32Bits
            != 0 || ((WireValue<uint32_t>_conflict *)&(local_f0.words)->content)->value != 0) {
          WireHelpers::zeroObject(local_f0.segment,local_b8,(WirePointer *)local_f0.words);
          iVar17 = (int)local_b0;
          uVar16 = (uint)local_c8;
        }
        AVar23.words = local_f0.words;
        AVar23.segment = local_f0.segment;
        local_f8._0_4_ = (uint)local_f8 << 6;
        pwVar8 = (local_f0.segment)->pos;
        uVar6 = uVar6 & 0xffffffff;
        if (((long)((long)((local_f0.segment)->super_SegmentReader).ptr.ptr +
                   (((local_f0.segment)->super_SegmentReader).ptr.size_ * 8 - (long)pwVar8)) >> 3 <
             (long)uVar6) || ((local_f0.segment)->pos = pwVar8 + uVar6, pwVar8 == (word *)0x0)) {
          pBVar4 = (BuilderArena *)((local_f0.segment)->super_SegmentReader).arena;
          if (0x1fffffff < iVar17 + 2U) {
            WireHelpers::allocate::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&_kjCondition);
          }
          AVar23 = BuilderArena::allocate(pBVar4,iVar17 + 2U);
          ((WireValue<uint32_t>_conflict *)&(local_f0.words)->content)->value =
               (int)AVar23.words - *(int *)&((AVar23.segment)->super_SegmentReader).ptr.ptr &
               0xfffffff8U | 2;
          *(uint *)((long)local_f0.words + 4) = ((AVar23.segment)->super_SegmentReader).id.value;
          *(undefined4 *)&(AVar23.words)->content = 1;
          pwVar8 = AVar23.words + 1;
          uVar16 = (uint)local_c8;
          iVar17 = (int)local_b0;
          pWVar10 = local_c0;
        }
        else {
          ((WireValue<uint32_t>_conflict *)&(local_f0.words)->content)->value =
               ((uint)((ulong)((long)pwVar8 - (long)local_f0.words) >> 1) & 0xfffffffc) - 3;
        }
        local_f0.words = AVar23.words;
        local_f8 = (WirePointer *)CONCAT44(local_f8._4_4_,(uint)local_f8 + uVar16);
        *(int *)((long)&(local_f0.words)->content + 4) = iVar17 * 8 + 7;
        LVar15 = (ListElementCount)local_e0;
        *(ListElementCount *)&pwVar8->content = LVar15 * 4;
        *(short *)((long)&pwVar8->content + 4) = (short)uVar9;
        *(short *)((long)&pwVar8->content + 6) = (short)local_fc;
        pWVar11 = (WirePointer *)(pwVar8 + 1);
        iVar17 = (int)local_d8;
        pWVar14 = pWVar10;
        local_a8 = pWVar11;
        local_f0 = AVar23;
        if (oldSize == POINTER) {
          if (7 < uVar12) {
            pWVar11 = pWVar11 + (uVar9 & 0xffff);
            uVar13 = local_e0 & 0xffffffff;
            do {
              WireHelpers::transferPointer(local_f0.segment,pWVar11,this_00,pWVar10);
              LVar15 = (ListElementCount)local_e0;
              pWVar10 = pWVar10 + 1;
              pWVar11 = (WirePointer *)
                        ((long)&(pWVar11->offsetAndKind).value + (ulong)(uint)(iVar17 * 8));
              uVar12 = (int)uVar13 - 1;
              uVar13 = (ulong)uVar12;
            } while (uVar12 != 0);
          }
        }
        else if (7 < uVar12) {
          uVar18 = local_e0 & 0xffffffff;
          uVar6 = local_e0;
          do {
            if (0xfffffffffffffffb < uVar13 - 6) {
              memcpy(pWVar11,pWVar10,(ulong)(uVar16 >> 3));
              pWVar14 = local_c0;
              uVar6 = local_e0;
            }
            LVar15 = (ListElementCount)uVar6;
            pWVar10 = (WirePointer *)((long)&(pWVar10->offsetAndKind).value + (ulong)(uVar16 >> 3));
            pWVar11 = (WirePointer *)
                      ((long)&(pWVar11->offsetAndKind).value + (ulong)(uint)(iVar17 * 8));
            uVar12 = (int)uVar18 - 1;
            uVar18 = (ulong)uVar12;
          } while (uVar12 != 0);
        }
        uVar6 = ((ulong)local_f8 & 0xffffffff) * local_98;
        uVar13 = uVar6 + 0x3f;
        if (0x7ffffff80 < uVar6) {
          WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&_kjCondition);
          LVar15 = (ListElementCount)local_e0;
        }
        __return_storage_ptr__ = local_a0;
        pWVar10 = local_a8;
        capTable = local_b8;
        uVar12 = local_fc;
        if ((int)(uVar13 >> 6) != 0) {
          memset(pWVar14,0,(ulong)((uint)(uVar13 >> 3) & 0xfffffff8));
          LVar15 = (ListElementCount)local_e0;
        }
        this_00 = local_f0.segment;
LAB_00356c5e:
        __return_storage_ptr__->segment = this_00;
        __return_storage_ptr__->capTable = capTable;
        __return_storage_ptr__->ptr = (byte *)pWVar10;
        __return_storage_ptr__->elementCount = LVar15;
        __return_storage_ptr__->step = (uint)local_d8 << 6;
        __return_storage_ptr__->structDataSize = local_cc << 6;
        __return_storage_ptr__->structPointerCount = (StructPointerCount)uVar12;
        goto LAB_00356c8c;
      }
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize&,capnp::ElementSize>&,char_const(&)[123]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x61b,FAILED,"oldSize != ElementSize::BIT",
                 "_kjCondition,\"Schema mismatch: Found bit list where struct list was expected; upgrading boolean \" \"lists to structs is no longer supported.\""
                 ,(DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)&_kjCondition,
                 (char (*) [123])
                 "Schema mismatch: Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
                );
      kj::_::Debug::Fault::~Fault(&f);
      capTable = local_b8;
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[85]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x5bb,FAILED,"oldRef->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Called getList{Field,Element}() but existing pointer is not a \" \"list.\""
                 ,&_kjCondition,
                 (char (*) [85])
                 "Schema mismatch: Called getList{Field,Element}() but existing pointer is not a list."
                );
LAB_0035639f:
      kj::_::Debug::Fault::~Fault(&f);
    }
LAB_003561f8:
    if (((WirePointer *)defaultValue == (WirePointer *)0x0) ||
       ((((WirePointer *)defaultValue)->field_1).upper32Bits == 0 &&
        (((WirePointer *)defaultValue)->offsetAndKind).value == 0)) {
      __return_storage_ptr__->ptr = (byte *)0x0;
      __return_storage_ptr__->elementCount = 0;
      __return_storage_ptr__->step = 0;
      __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
      __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
LAB_00356c8c:
      __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
      return __return_storage_ptr__;
    }
    local_c0 = (WirePointer *)
               WireHelpers::copyMessage
                         (&local_f0.segment,capTable,(WirePointer **)&local_f0.words,
                          (WirePointer *)defaultValue);
    uVar12 = ((WireValue<uint32_t>_conflict *)&(local_f0.words)->content)->value;
    defaultValue = (word *)0x0;
  } while( true );
}

Assistant:

ListBuilder PointerBuilder::getStructList(StructSize elementSize, const word* defaultValue) {
  return WireHelpers::getWritableStructListPointer(
      pointer, segment, capTable, elementSize, defaultValue);
}